

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

int hash_remove(HashTable *table,void *key)

{
  void *pvVar1;
  uint32 uVar2;
  int iVar3;
  HashItem *pHVar4;
  HashItem **ppHVar5;
  uint uVar6;
  HashItem *pHVar7;
  
  pvVar1 = table->data;
  uVar2 = (*table->hash)(key,pvVar1);
  uVar6 = table->table_len - 1 & uVar2;
  pHVar7 = table->table[uVar6];
  if (pHVar7 == (HashItem *)0x0) {
LAB_00124c41:
    iVar3 = 0;
  }
  else {
    iVar3 = (*table->keymatch)(key,pHVar7->key,pvVar1);
    if (iVar3 == 0) {
      do {
        pHVar4 = pHVar7;
        pHVar7 = pHVar4->next;
        if (pHVar7 == (HashItem *)0x0) goto LAB_00124c41;
        iVar3 = (*table->keymatch)(key,pHVar7->key,pvVar1);
      } while (iVar3 == 0);
    }
    else {
      pHVar4 = (HashItem *)0x0;
    }
    if (pHVar4 == (HashItem *)0x0) {
      ppHVar5 = table->table + uVar6;
    }
    else {
      ppHVar5 = &pHVar4->next;
    }
    *ppHVar5 = pHVar7->next;
    (*table->nuke)(pHVar7->key,pHVar7->value,pvVar1);
    (*table->f)(pHVar7,table->d);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int hash_remove(HashTable *table, const void *key)
{
    HashItem *item = NULL;
    HashItem *prev = NULL;
    void *data = table->data;
    const uint32 hash = calc_hash(table, key);
    for (item = table->table[hash]; item != NULL; item = item->next)
    {
        if (table->keymatch(key, item->key, data))
        {
            if (prev != NULL)
                prev->next = item->next;
            else
                table->table[hash] = item->next;

            table->nuke(item->key, item->value, data);
            table->f(item, table->d);
            return 1;
        } // if

        prev = item;
    } // for

    return 0;
}